

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::find<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
           *this,key_arg<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                 *key)

{
  size_t hash;
  iterator iVar1;
  
  AssertHashEqConsistent<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            (this,key);
  if (*(long *)this == 1) {
    iVar1 = find_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                      (this,key);
    return iVar1;
  }
  if (*(long *)this != 0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
    ::prefetch_heap_block
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                *)this);
    hash = hash_internal::MixingHashState::
           hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>,_0>
                     (key);
    iVar1 = find_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                      (this,key,hash);
    return iVar1;
  }
  __assert_fail("!kEnabled || cap >= kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb37,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
               );
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }